

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

uint __thiscall llvm::ARM::getDefaultFPU(ARM *this,StringRef CPU,ArchKind AK)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  switch(CPU.Data) {
  case (char *)0x4:
    if (*(int *)this == 0x326d7261) {
      return 1;
    }
    if (*(int *)this == 0x336d7261) {
      return 1;
    }
    if (*(int *)this == 0x366d7261) {
      return 1;
    }
    if (*(int *)this != 0x386d7261) {
      if (*(int *)this == 0x396d7261) {
        return 1;
      }
      if (*(int *)this != 0x6f79726b) {
        return 0;
      }
      return 0x14;
    }
    return 1;
  case (char *)0x5:
    if (this[4] == (ARM)0x6d && *(int *)this == 0x376d7261) {
      return 1;
    }
    if (this[4] == (ARM)0x65 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (this[4] == (ARM)0x30 && *(int *)this == 0x30306373) {
      return 1;
    }
    if (this[4] != (ARM)0x74 || *(int *)this != 0x6961726b) {
      if (this[4] == (ARM)0x30 && *(int *)this == 0x30336373) {
        return 1;
      }
      if (this[4] != (ARM)0x74 || *(int *)this != 0x66697773) {
        return 0;
      }
      return 0x12;
    }
    return 0x12;
  case (char *)0x6:
    if (*(short *)(this + 4) == 0x3031 && *(int *)this == 0x386d7261) {
      return 1;
    }
    if (*(short *)(this + 4) == 0x3032 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(short *)(this + 4) == 0x3231 && *(int *)this == 0x33397065) {
      return 1;
    }
    if (*(short *)(this + 4) != 0x6530 || *(int *)this != 0x316d7261) {
      if (*(short *)(this + 4) == 0x6572 && *(int *)this == 0x6f63706d) {
        return 3;
      }
      if (*(short *)(this + 4) != 0x7478 || *(int *)this != 0x6d6d7769) {
        if (*(short *)(this + 4) != 0x656c || *(int *)this != 0x61637378) {
          return 0;
        }
        return 1;
      }
      return 1;
    }
    return 1;
  case (char *)0x7:
    if (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567) {
      return *(uint *)(&DAT_001d1780 + (CPU.Length & 0xffffffff) * 0x40);
    }
    if (*(int *)(this + 3) == 0x74303137 && *(int *)this == 0x376d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x74303237 && *(int *)this == 0x376d7261) {
      return 1;
    }
    if (*(int *)(this + 3) != 0x74303239 || *(int *)this != 0x396d7261) {
      if (*(int *)(this + 3) == 0x74323239 && *(int *)this == 0x396d7261) {
        return 1;
      }
      if (*(int *)(this + 3) != 0x32313339 || *(int *)this != 0x396d7261) {
        if (*(int *)(this + 3) != 0x74303439 || *(int *)this != 0x396d7261) {
          uVar1 = 0x14;
          if (*(int *)(this + 3) != 0x656e6f6c || *(int *)this != 0x6c637963) {
            uVar1 = 0;
          }
          return uVar1;
        }
        return 1;
      }
      return 1;
    }
    return 1;
  case (char *)0x8:
    if (*(long *)this == 0x696d6474376d7261) {
      return 1;
    }
    if (*(long *)this == 0x696d6474396d7261) {
      return 1;
    }
    if (*(long *)this == 0x74303230316d7261) {
      return 1;
    }
    if (*(long *)this != 0x65303230316d7261) {
      if (*(long *)this != 0x65323230316d7261) {
        return 0;
      }
      return 1;
    }
    return 1;
  case (char *)0x9:
    if ((((this[8] == (ARM)0x6d && *(long *)this == 0x7261676e6f727473) ||
         (this[8] == (ARM)0x69 && *(long *)this == 0x6d647430316d7261)) ||
        (this[8] == (ARM)0x73 && *(long *)this == 0x2d653634396d7261)) ||
       (((this[8] == (ARM)0x73 && *(long *)this == 0x2d653636396d7261 ||
         (this[8] == (ARM)0x73 && *(long *)this == 0x2d653836396d7261)) ||
        ((this[8] == (ARM)0x30 && *(long *)this == 0x6d2d786574726f63 ||
         (this[8] == (ARM)0x31 && *(long *)this == 0x6d2d786574726f63)))))) {
      return 1;
    }
    if (this[8] == (ARM)0x35 && *(long *)this == 0x612d786574726f63) {
      return 0x12;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x612d786574726f63) {
      return 0x12;
    }
    if (this[8] == (ARM)0x38 && *(long *)this == 0x612d786574726f63) {
      return 0x10;
    }
    if (this[8] == (ARM)0x39 && *(long *)this == 0x612d786574726f63) {
      return 0x11;
    }
    if (this[8] == (ARM)0x34 && *(long *)this == 0x722d786574726f63) {
      return 1;
    }
    if (this[8] == (ARM)0x35 && *(long *)this == 0x722d786574726f63) {
      return 6;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x722d786574726f63) {
      return 7;
    }
    if (this[8] == (ARM)0x38 && *(long *)this == 0x722d786574726f63) {
      return 7;
    }
    if (this[8] == (ARM)0x33 && *(long *)this == 0x6d2d786574726f63) {
      return 1;
    }
    if (this[8] == (ARM)0x34 && *(long *)this == 0x6d2d786574726f63) {
      return 0xc;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x6d2d786574726f63) {
      return 0xd;
    }
    uVar1 = 0x14;
    if (this[8] == (ARM)0x31 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    if (this[8] == (ARM)0x32 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    if (this[8] == (ARM)0x33 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    uVar2 = *(ulong *)this ^ 0x6d2d736f6e797865;
    uVar3 = (ulong)(byte)this[8] ^ 0x34;
    break;
  case (char *)0xa:
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x696d6474376d7261) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a653632396d7261) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363331316d7261) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363731316d7261) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x3231 && *(long *)this == 0x612d786574726f63) {
      return 0x12;
    }
    if (*(short *)(this + 8) == 0x3531 && *(long *)this == 0x612d786574726f63) {
      return 0x12;
    }
    if (*(short *)(this + 8) == 0x3731 && *(long *)this == 0x612d786574726f63) {
      return 0x12;
    }
    if (*(short *)(this + 8) == 0x6634 && *(long *)this == 0x722d786574726f63) {
      return 6;
    }
    if (*(short *)(this + 8) == 0x3235 && *(long *)this == 0x722d786574726f63) {
      return 0x13;
    }
    if (*(short *)(this + 8) == 0x3332 && *(long *)this == 0x6d2d786574726f63) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x3333 && *(long *)this == 0x6d2d786574726f63) {
      return 0xe;
    }
    uVar1 = 0x14;
    if (*(short *)(this + 8) == 0x3233 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3335 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3535 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3735 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3237 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3337 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    uVar2 = *(ulong *)this ^ 0x612d786574726f63;
    uVar3 = (ulong)*(ushort *)(this + 8) ^ 0x3537;
    break;
  case (char *)0xb:
    if (*(long *)(this + 3) == 0x732d666a36333131 && *(long *)this == 0x6a363331316d7261) {
      return 3;
    }
    uVar1 = 1;
    if (*(long *)(this + 3) == 0x732d7a6a36333131 && *(long *)this == 0x6a363331316d7261) {
      return 1;
    }
    if (*(long *)(this + 3) == 0x732d7a6a36373131 && *(long *)this == 0x6a363731316d7261) {
      return 1;
    }
    if (*(long *)(this + 3) == 0x7066766f6e65726f && *(long *)this == 0x6f6e65726f63706d) {
      return 1;
    }
    uVar2 = *(ulong *)this ^ 0x74363531316d7261;
    uVar3 = *(ulong *)(this + 3) ^ 0x732d327436353131;
    break;
  case (char *)0xc:
    if (*(int *)(this + 8) == 0x3031316d && *(long *)this == 0x7261676e6f727473) {
      return 1;
    }
    uVar1 = 3;
    if (*(int *)(this + 8) == 0x732d667a && *(long *)this == 0x6a363731316d7261) {
      return 3;
    }
    uVar2 = *(ulong *)this ^ 0x74363531316d7261;
    uVar3 = (ulong)*(uint *)(this + 8) ^ 0x732d6632;
    break;
  case (char *)0xd:
    uVar1 = 1;
    if (*(long *)(this + 5) == 0x303031316d726167 && *(long *)this == 0x7261676e6f727473) {
      return 1;
    }
    if (*(long *)(this + 5) == 0x303131316d726167 && *(long *)this == 0x7261676e6f727473) {
      return 1;
    }
    uVar2 = *(ulong *)this ^ 0x6d2d786574726f63;
    uVar3 = *(ulong *)(this + 5) ^ 0x73756c70306d2d78;
    break;
  default:
    goto LAB_00180768;
  }
  if (uVar3 == 0 && uVar2 == 0) {
    return uVar1;
  }
LAB_00180768:
  return 0;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }